

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::TaskSet::Task::destroy(Task *this)

{
  Task *this_local;
  
  kj::_::freePromise<kj::TaskSet::Task>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }